

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb-lookup.h
# Opt level: O0

TranslationBlock *
tb_lookup__cpu_state
          (CPUState *cpu,target_ulong *pc,target_ulong *cs_base,uint32_t *flags,uint32_t cf_mask)

{
  uint uVar1;
  CPUTriCoreState *env_00;
  uint uVar2;
  uint cf_mask_00;
  uint32_t uVar3;
  bool bVar4;
  uint32_t hash;
  TranslationBlock *tb;
  CPUArchState_conflict28 *env;
  uint32_t cf_mask_local;
  uint32_t *flags_local;
  target_ulong *cs_base_local;
  target_ulong *pc_local;
  CPUState *cpu_local;
  
  env_00 = (CPUTriCoreState *)cpu->env_ptr;
  cpu_get_tb_cpu_state(env_00,pc,cs_base,flags);
  uVar2 = tb_jmp_cache_hash_func(env_00->uc,(ulong)(uint)*pc);
  cpu_local = (CPUState *)cpu->tb_jmp_cache[uVar2];
  cf_mask_00 = cpu->cluster_index << 0x18 | cf_mask & 0xffffff;
  bVar4 = false;
  if ((((cpu_local != (CPUState *)0x0) &&
       (bVar4 = false, (int)*(target_ulong *)&cpu_local->nr_cores == (int)*pc)) &&
      (bVar4 = false, cpu_local->nr_threads == (int)*cs_base)) &&
     ((bVar4 = false, *(uint32_t *)&cpu_local->thread == *flags &&
      (uVar1._0_1_ = cpu_local->crash_occurred, uVar1._1_1_ = cpu_local->exit_request,
      uVar1._2_1_ = cpu_local->in_exclusive_context, uVar1._3_1_ = cpu_local->field_0x17,
      bVar4 = false, (ulong)uVar1 == cpu->trace_dstate[0])))) {
    uVar3 = tb_cflags((TranslationBlock *)cpu_local);
    bVar4 = (uVar3 & 0xff0effff) == cf_mask_00;
  }
  if (!bVar4) {
    cpu_local = (CPUState *)
                tb_htable_lookup_tricore
                          (cpu,(ulong)(uint)*pc,(ulong)(uint)*cs_base,*flags,cf_mask_00);
    if (cpu_local == (CPUState *)0x0) {
      cpu_local = (CPUState *)0x0;
    }
    else {
      cpu->tb_jmp_cache[uVar2] = (TranslationBlock *)cpu_local;
    }
  }
  return (TranslationBlock *)cpu_local;
}

Assistant:

static inline TranslationBlock *
tb_lookup__cpu_state(CPUState *cpu, target_ulong *pc, target_ulong *cs_base,
                     uint32_t *flags, uint32_t cf_mask)
{
    CPUArchState *env = (CPUArchState *)cpu->env_ptr;
    TranslationBlock *tb;
    uint32_t hash;

    cpu_get_tb_cpu_state(env, pc, cs_base, flags);
    hash = tb_jmp_cache_hash_func(env->uc, *pc);
    tb = cpu->tb_jmp_cache[hash];

    cf_mask &= ~CF_CLUSTER_MASK;
    cf_mask |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    if (likely(tb &&
               tb->pc == *pc &&
               tb->cs_base == *cs_base &&
               tb->flags == *flags &&
               tb->trace_vcpu_dstate == *cpu->trace_dstate &&
               (tb_cflags(tb) & (CF_HASH_MASK | CF_INVALID)) == cf_mask)) {
        return tb;
    }
    tb = tb_htable_lookup(cpu, *pc, *cs_base, *flags, cf_mask);
    if (tb == NULL) {
        return NULL;
    }
    cpu->tb_jmp_cache[hash] = tb;
    return tb;
}